

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O3

int32_t ulocimp_getRegionForSupplementalData_63
                  (char *localeID,UBool inferRegion,char *region,int32_t regionCapacity,
                  UErrorCode *status)

{
  char cVar1;
  int32_t iVar2;
  int length;
  char *pcVar3;
  char rgBuf [8];
  UErrorCode rgStatus;
  char locBuf [157];
  char local_e4 [2];
  int local_e2;
  char local_de;
  UErrorCode local_dc;
  char local_d8 [168];
  
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  local_dc = U_ZERO_ERROR;
  iVar2 = uloc_getKeywordValue_63(localeID,"rg",local_e4,8,&local_dc);
  if ((local_dc < U_ILLEGAL_ARGUMENT_ERROR) && (iVar2 == 6)) {
    if (local_e4[0] != '\0') {
      pcVar3 = local_e4;
      do {
        pcVar3 = pcVar3 + 1;
        cVar1 = uprv_toupper_63(local_e4[0]);
        pcVar3[-1] = cVar1;
        local_e4[0] = *pcVar3;
      } while (local_e4[0] != '\0');
    }
    if (local_de == '\0' && local_e2 == 0x5a5a5a5a) {
      length = 2;
      goto LAB_00299533;
    }
  }
  iVar2 = uloc_getCountry_63(localeID,local_e4,8,status);
  length = 0;
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (length = iVar2, inferRegion != '\0' && iVar2 == 0)) {
    local_dc = U_ZERO_ERROR;
    uloc_addLikelySubtags_63(localeID,local_d8,0x9d,&local_dc);
    length = 0;
    if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = uloc_getCountry_63(local_d8,local_e4,8,status);
      length = 0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        length = iVar2;
      }
    }
  }
LAB_00299533:
  local_e4[length] = '\0';
  strncpy(region,local_e4,(long)regionCapacity);
  iVar2 = u_terminateChars_63(region,regionCapacity,length,status);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_getRegionForSupplementalData(const char *localeID, UBool inferRegion,
                                     char *region, int32_t regionCapacity, UErrorCode* status) {
    if (U_FAILURE(*status)) {
        return 0;
    }
    char rgBuf[ULOC_RG_BUFLEN];
    UErrorCode rgStatus = U_ZERO_ERROR;

    // First check for rg keyword value
    int32_t rgLen = uloc_getKeywordValue(localeID, "rg", rgBuf, ULOC_RG_BUFLEN, &rgStatus);
    if (U_FAILURE(rgStatus) || rgLen != 6) {
        rgLen = 0;
    } else {
        // rgBuf guaranteed to be zero terminated here, with text len 6
        char *rgPtr = rgBuf;
        for (; *rgPtr!= 0; rgPtr++) {
            *rgPtr = uprv_toupper(*rgPtr);
        }
        rgLen = (uprv_strcmp(rgBuf+2, "ZZZZ") == 0)? 2: 0;
    }

    if (rgLen == 0) {
        // No valid rg keyword value, try for unicode_region_subtag
        rgLen = uloc_getCountry(localeID, rgBuf, ULOC_RG_BUFLEN, status);
        if (U_FAILURE(*status)) {
            rgLen = 0;
        } else if (rgLen == 0 && inferRegion) {
            // no unicode_region_subtag but inferRegion TRUE, try likely subtags
            char locBuf[ULOC_FULLNAME_CAPACITY];
            rgStatus = U_ZERO_ERROR;
            (void)uloc_addLikelySubtags(localeID, locBuf, ULOC_FULLNAME_CAPACITY, &rgStatus);
            if (U_SUCCESS(rgStatus)) {
                rgLen = uloc_getCountry(locBuf, rgBuf, ULOC_RG_BUFLEN, status);
                if (U_FAILURE(*status)) {
                    rgLen = 0;
                }
            }
        }
    }

    rgBuf[rgLen] = 0;
    uprv_strncpy(region, rgBuf, regionCapacity);
    return u_terminateChars(region, regionCapacity, rgLen, status);
}